

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12_string_object.cpp
# Opt level: O3

void display_all_strings(string *list,int n)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  
  if (0 < n) {
    iVar2 = 1;
    lVar3 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,*(char **)((long)&(list->_M_dataplus)._M_p + lVar3),
                          *(long *)((long)&list->_M_string_length + lVar3));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      lVar3 = lVar3 + 0x20;
      iVar2 = iVar2 + 1;
    } while ((ulong)(uint)n << 5 != lVar3);
  }
  return;
}

Assistant:

void display_all_strings(const std::string list[], int n) {
    for(int i = 0; i < n; i++) {
        std::cout << i + 1 << " : " << list[i] << std::endl;
    }
}